

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensor_als.cpp
# Opt level: O0

void __thiscall SensorALS::update_values(SensorALS *this)

{
  int iVar1;
  mapped_type *pmVar2;
  float fVar3;
  allocator<char> local_69;
  key_type local_68;
  allocator<char> local_31;
  key_type local_30;
  SensorALS *local_10;
  SensorALS *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"in_intensity_both_value",&local_31);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
           ::operator[](&(this->super_SensorBase).dict,&local_30);
  iVar1 = std::any_cast<int>(pmVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"in_intensity_scale",&local_69);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
           ::operator[](&(this->super_SensorBase).dict,&local_68);
  fVar3 = std::any_cast<float>(pmVar2);
  this->value = (float)iVar1 * fVar3;
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  if ((this->debug & 1U) != 0) {
    printf("ALS reading: %.2f\n",(double)this->value);
  }
  return;
}

Assistant:

void SensorALS::update_values()
{
	value=std::any_cast<int>(dict["in_intensity_both_value"])*
	std::any_cast<float>(dict["in_intensity_scale"]);
	if(debug)printf("ALS reading: %.2f\n",value);
}